

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

void __thiscall
llvm::Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_>::~Expected
          (Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *this)

{
  storage_type *this_00;
  error_type *this_01;
  Expected<llvm::SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>_> *this_local;
  
  assertIsChecked(this);
  if ((this->field_0x30 & 1) == 0) {
    this_00 = getStorage(this);
    SmallVector<(anonymous_namespace)::ContentDescriptor,_4U>::~SmallVector(this_00);
  }
  else {
    this_01 = getErrorStorage(this);
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::~unique_ptr
              (this_01);
  }
  return;
}

Assistant:

~Expected() {
    assertIsChecked();
    if (!HasError)
      getStorage()->~storage_type();
    else
      getErrorStorage()->~error_type();
  }